

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O2

ON_XMLNode * __thiscall ON_Displacement::AddChildXML(ON_Displacement *this,ON_XMLRootNode *root)

{
  int iVar1;
  CImpl *in_RAX;
  ON_XMLNode *pOVar2;
  SubItem *this_00;
  ON_XMLNode *this_01;
  undefined4 extraout_var;
  SubItemIterator it;
  SubItemIterator local_28;
  
  local_28.m_impl = in_RAX;
  pOVar2 = ON_MeshModifier::AddChildXML(&this->super_ON_MeshModifier,root);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    SubItemIterator::SubItemIterator(&local_28,this);
    while( true ) {
      this_00 = SubItemIterator::CImpl::Next(local_28.m_impl);
      if (this_00 == (SubItem *)0x0) break;
      this_01 = (ON_XMLNode *)operator_new(0xe8);
      ON_XMLNode::ON_XMLNode(this_01,L"");
      iVar1 = (*pOVar2->_vptr_ON_XMLNode[0xb])(pOVar2,this_01);
      SubItem::ToXML(this_00,(ON_XMLNode *)CONCAT44(extraout_var,iVar1));
    }
    SubItemIterator::~SubItemIterator(&local_28);
  }
  return pOVar2;
}

Assistant:

ON_XMLNode* ON_Displacement::AddChildXML(ON_XMLRootNode& root) const
{
  ON_XMLNode* dsp_node = ON_MeshModifier::AddChildXML(root);
  if (nullptr != dsp_node)
  {
    auto it = GetSubItemIterator();
    SubItem* sub_item = nullptr;
    while (nullptr != (sub_item = it.Next()))
    {
      ON_XMLNode* sub_node = dsp_node->AttachChildNode(new ON_XMLNode(L""));
      sub_item->ToXML(*sub_node);
    }
  }

  return dsp_node;
}